

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall EventComparisonNode::Evaluate(EventComparisonNode *this,Date *date,string *event_to)

{
  __type _Var1;
  bool bVar2;
  
  switch(this->comp) {
  case Less:
    bVar2 = std::operator<(event_to,&this->event);
    return bVar2;
  case LessOrEqual:
    bVar2 = std::operator<=(event_to,&this->event);
    return bVar2;
  case Greater:
    bVar2 = std::operator>(event_to,&this->event);
    return bVar2;
  case GreaterOrEqual:
    bVar2 = std::operator>=(event_to,&this->event);
    return bVar2;
  case Equal:
    _Var1 = std::operator==(event_to,&this->event);
    return _Var1;
  case NotEqual:
    bVar2 = std::operator!=(event_to,&this->event);
    return bVar2;
  default:
    return true;
  }
}

Assistant:

bool EventComparisonNode::Evaluate(const Date &date, const string &event_to) const {
    switch (comp) {
        case Less:
            return event_to < event;
        case LessOrEqual:
            return event_to <= event;
        case Greater:
            return event_to > event;
        case GreaterOrEqual:
            return event_to >= event;
        case Equal:
            return event_to == event;
        case NotEqual:
            return event_to != event;
    }
    return true; // unreachable
}